

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O2

void * liblogger::LogUnixServer::Run(void *arg)

{
  int iVar1;
  int nclient;
  socklen_t addr_len;
  pollfd fds [2];
  sockaddr_un addr;
  
  do {
    fds[0].fd = *(int *)((long)arg + 0x70);
    fds[0].events = 1;
    fds[0].revents = 0;
    fds[1].fd = *(int *)((long)arg + 0x74);
    fds[1]._4_4_ = fds[0]._4_4_;
    iVar1 = poll((pollfd *)fds,2,0);
    if (iVar1 < 0) {
      abort();
    }
    if ((fds[0]._4_4_ & 0x10000) != 0) {
      addr_len = 0x6e;
      nclient = accept(*(int *)((long)arg + 0x70),(sockaddr *)&addr,&addr_len);
      if (-1 < nclient) {
        Lock((LogUnixServer *)arg);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)((long)arg + 0x38),&nclient);
        Unlock((LogUnixServer *)arg);
      }
    }
  } while ((fds[1]._4_4_ & 0x10000) == 0);
  return (void *)0x0;
}

Assistant:

void *LogUnixServer::Run(void *arg)
{
	LogUnixServer *self = (LogUnixServer *) arg;

	bool busy = true;
	while(busy)
	{
		struct pollfd fds[2];

		fds[0].fd = self->m_acceptfd;
		fds[0].events = POLLIN;
		fds[0].revents = 0;

		fds[1].fd = self->m_ctlfd[0];
		fds[1].events = POLLIN;
		fds[1].revents = 0;

		int ret = poll(fds, 2, 0);
		if (ret < 0)
		{
			switch(errno)
			{
				default:
					abort();
			}
		}

		if ( (fds[0].revents & POLLIN) ) {
			//Accept
			struct sockaddr_un addr;
			socklen_t addr_len = sizeof(addr);
			int nclient = accept(self->m_acceptfd, (struct sockaddr *) &addr, &addr_len);
			if (nclient >= 0)
			{
				self->Lock();
				self->m_list.push_back(nclient);
				self->Unlock();
			}
		}

		//Check eventfd and exit if it has data
		if ( (fds[1].revents & POLLIN) ) {
			busy = false;
		}

	}

	return NULL;
}